

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 addFloatx80Sigs(floatx80 a,floatx80 b,flag zSign,float_status *status)

{
  floatx80 fVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint64_t a0;
  uint zExp;
  uint uVar5;
  ulong zSig0;
  floatx80 fVar6;
  floatx80 a_00;
  uint64_t local_48;
  uint64_t bSig;
  uint64_t aSig;
  
  a0 = b.low;
  a_00.low = a.low;
  fVar6._8_8_ = a._8_8_ & 0xffffffff;
  fVar6.low = a_00.low;
  zExp = a._8_4_ & 0x7fff;
  uVar5 = b._8_4_ & 0x7fff;
  iVar2 = zExp - uVar5;
  bSig = a0;
  aSig = a_00.low;
  if (iVar2 == 0 || zExp < uVar5) {
    if (iVar2 < 0) {
      if (uVar5 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          fVar1._8_4_ = (uint)zSign << 0xf | 0x7fff;
          fVar1.low = 0x8000000000000000;
          fVar1._12_4_ = 0;
          return fVar1;
        }
        goto LAB_00b1bd08;
      }
      shift64ExtraRightJamming
                (a_00.low,0,
                 -iVar2 - (uint)(((undefined1  [16])a & (undefined1  [16])0x7fff) ==
                                (undefined1  [16])0x0),&aSig,&local_48);
      a_00.low = aSig;
      zExp = uVar5;
      goto LAB_00b1bd3f;
    }
    if (zExp == 0x7fff) {
      lVar3 = (a0 | a_00.low) << 1;
      goto LAB_00b1bcff;
    }
    zSig0 = a0 + a_00.low;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
      if (zSig0 == 0) {
        return (floatx80)(ZEXT116(zSign) << 0x4f);
      }
      uVar4 = 0x3f;
      if (zSig0 != 0) {
        for (; zSig0 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      zSig0 = zSig0 << ((byte)(uVar4 ^ 0x3f) & 0x3f);
      zExp = 1 - (int)(uVar4 ^ 0x3f);
      local_48 = 0;
      goto LAB_00b1bdae;
    }
    uVar4 = 0;
  }
  else {
    if (zExp == 0x7fff) {
      lVar3 = a_00.low * 2;
LAB_00b1bcff:
      if (lVar3 == 0) {
        return fVar6;
      }
LAB_00b1bd08:
      a_00._8_8_ = a._8_8_ & 0xffffffff;
      fVar6 = propagateFloatx80NaN_tricore(a_00,b,status);
      return fVar6;
    }
    shift64ExtraRightJamming
              (a0,0,iVar2 - (uint)(((undefined1  [16])b & (undefined1  [16])0x7fff) ==
                                  (undefined1  [16])0x0),&bSig,&local_48);
    a0 = bSig;
LAB_00b1bd3f:
    zSig0 = a0 + a_00.low;
    if ((long)zSig0 < 0) goto LAB_00b1bdae;
    uVar4 = (ulong)(local_48 != 0);
  }
  local_48 = zSig0 << 0x3f | uVar4;
  zSig0 = (zSig0 >> 1) + 0x8000000000000000;
  zExp = zExp + 1;
LAB_00b1bdae:
  fVar6 = roundAndPackFloatx80_tricore
                    (status->floatx80_rounding_precision,zSign,zExp,zSig0,local_48,status);
  return fVar6;
}

Assistant:

static floatx80 addFloatx80Sigs(floatx80 a, floatx80 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    int32_t expDiff;

    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) {
        if ( aExp == 0x7FFF ) {
            if ((uint64_t)(aSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            return a;
        }
        if ( bExp == 0 ) --expDiff;
        shift64ExtraRightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
        zExp = aExp;
    }
    else if ( expDiff < 0 ) {
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            return packFloatx80(zSign,
                                floatx80_infinity_high,
                                floatx80_infinity_low);
        }
        if ( aExp == 0 ) ++expDiff;
        shift64ExtraRightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
        zExp = bExp;
    }
    else {
        if ( aExp == 0x7FFF ) {
            if ( (uint64_t) ( ( aSig | bSig )<<1 ) ) {
                return propagateFloatx80NaN(a, b, status);
            }
            return a;
        }
        zSig1 = 0;
        zSig0 = aSig + bSig;
        if ( aExp == 0 ) {
            if (zSig0 == 0) {
                return packFloatx80(zSign, 0, 0);
            }
            normalizeFloatx80Subnormal( zSig0, &zExp, &zSig0 );
            goto roundAndPack;
        }
        zExp = aExp;
        goto shiftRight1;
    }
    zSig0 = aSig + bSig;
    if ( (int64_t) zSig0 < 0 ) goto roundAndPack;
 shiftRight1:
    shift64ExtraRightJamming( zSig0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= UINT64_C(0x8000000000000000);
    ++zExp;
 roundAndPack:
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}